

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_database.cpp
# Opt level: O1

Mesh * MeshDb::create_mesh(Mesh *__return_storage_ptr__,
                          vector<Vertex,_std::allocator<Vertex>_> *p_vertices,
                          vector<unsigned_int,_std::allocator<unsigned_int>_> *p_indices,
                          vector<Texture,_std::allocator<Texture>_> *p_textures)

{
  pointer pVVar1;
  pointer puVar2;
  GLuint mesh_ebo_gl_id;
  GLuint mesh_vbo_gl_id;
  GLuint mesh_vao_gl_id;
  size_t mesh_id;
  GLuint local_a4;
  GLuint local_a0;
  GLuint local_9c;
  __atomic_base<unsigned_long> local_98;
  pair<unsigned_long,_Mesh> local_90;
  
  LOCK();
  UNLOCK();
  local_98 = create_mesh::mesh_id_counter.super___atomic_base<unsigned_long>._M_i;
  local_9c = 0;
  local_a0 = 0;
  local_a4 = 0;
  create_mesh::mesh_id_counter.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       (__atomic_base<unsigned_long>)
       (create_mesh::mesh_id_counter.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  (*glad_glGenVertexArrays)(1,&local_9c);
  (*glad_glGenBuffers)(1,&local_a0);
  (*glad_glGenBuffers)(1,&local_a4);
  (*glad_glBindVertexArray)(local_9c);
  (*glad_glBindBuffer)(0x8892,local_a0);
  pVVar1 = (p_vertices->super__Vector_base<Vertex,_std::allocator<Vertex>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (*glad_glBufferData)
            (0x8892,(long)(p_vertices->super__Vector_base<Vertex,_std::allocator<Vertex>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pVVar1,pVVar1,0x88e4);
  (*glad_glBindBuffer)(0x8893,local_a4);
  puVar2 = (p_indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (*glad_glBufferData)
            (0x8893,(long)(p_indices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2,puVar2,0x88e4);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0x38,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(1);
  (*glad_glVertexAttribPointer)(1,3,0x1406,'\0',0x38,(void *)0xc);
  (*glad_glEnableVertexAttribArray)(2);
  (*glad_glVertexAttribPointer)(2,2,0x1406,'\0',0x38,(void *)0x30);
  (*glad_glEnableVertexAttribArray)(3);
  (*glad_glVertexAttribPointer)(3,3,0x1406,'\0',0x38,(void *)0x18);
  (*glad_glEnableVertexAttribArray)(4);
  (*glad_glVertexAttribPointer)(4,3,0x1406,'\0',0x38,(void *)0x24);
  (*glad_glBindVertexArray)(0);
  ::Mesh::Mesh(__return_storage_ptr__,local_9c,local_a0,local_a4,p_vertices,p_indices,p_textures);
  std::pair<unsigned_long,_Mesh>::pair<Mesh_&,_true>
            (&local_90,&local_98._M_i,__return_storage_ptr__);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,Mesh>,std::allocator<std::pair<unsigned_long_const,Mesh>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long,Mesh>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Mesh>,std::allocator<std::pair<unsigned_long_const,Mesh>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)map,&local_90);
  if (local_90.second.m_textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.second.m_textures.super__Vector_base<Texture,_std::allocator<Texture>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.second.m_textures.
                          super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.second.m_textures.
                          super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.second.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.second.m_indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.second.m_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.second.m_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.second.m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.second.m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.second.m_vertices.
                          super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.second.m_vertices.
                          super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh MeshDb::create_mesh(
    const std::vector<Vertex> &p_vertices,
    const std::vector<unsigned int> &p_indices,
    const std::vector<Texture> &p_textures) noexcept
{
    static std::atomic<std::size_t> mesh_id_counter = 1;
    const std::size_t mesh_id = mesh_id_counter++;
    GLuint mesh_vao_gl_id = 0;
    GLuint mesh_vbo_gl_id = 0;
    GLuint mesh_ebo_gl_id = 0;

    glGenVertexArrays(1, &mesh_vao_gl_id);
    glGenBuffers(1, &mesh_vbo_gl_id);
    glGenBuffers(1, &mesh_ebo_gl_id);

    glBindVertexArray(mesh_vao_gl_id);
    glBindBuffer(GL_ARRAY_BUFFER, mesh_vbo_gl_id);

    glBufferData(
        GL_ARRAY_BUFFER,
        p_vertices.size() * sizeof(Vertex),
        &p_vertices[0],
        GL_STATIC_DRAW);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, mesh_ebo_gl_id);
    glBufferData(
        GL_ELEMENT_ARRAY_BUFFER,
        p_indices.size() * sizeof(unsigned int),
        &p_indices[0],
        GL_STATIC_DRAW);

    // vertex positions
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)0);

    // vertex normals
    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_normal));

    // vertex texture coords
    glEnableVertexAttribArray(2);
    glVertexAttribPointer(2, 2, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_tex_coord));

    // vertex tangent
    glEnableVertexAttribArray(3);
    glVertexAttribPointer(3, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_tangent));

    // vertex bitangent
    glEnableVertexAttribArray(4);
    glVertexAttribPointer(4, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, m_bitangent));

    glBindVertexArray(0);

    Mesh mesh = Mesh(
        mesh_vao_gl_id,
        mesh_vbo_gl_id,
        mesh_ebo_gl_id,
        p_vertices,
        p_indices,
        p_textures);
    map.emplace(
        std::make_pair(
            mesh_id,
            mesh));
    return mesh;
}